

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigLoad(Fts5Config *pConfig,int iCookie)

{
  char *zSql_00;
  int in_ESI;
  Fts5Config *in_RDI;
  long in_FS_OFFSET;
  sqlite3_value *pVal;
  char *zK;
  int iVersion;
  char *zSql;
  char *zSelect;
  int bDummy;
  int rc;
  sqlite3_stmt *p;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  sqlite3_value *in_stack_ffffffffffffffb0;
  sqlite3_stmt *in_stack_ffffffffffffffb8;
  uint nBytes;
  char *db;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  uint uVar2;
  char *zKey;
  Fts5Config *pConfig_00;
  
  pConfig_00 = *(Fts5Config **)(in_FS_OFFSET + 0x28);
  db = "SELECT k, v FROM %Q.\'%q_config\'";
  zKey = (char *)0x0;
  iVar1 = 0;
  nBytes = 0;
  in_RDI->pgsz = 0xfd2;
  in_RDI->nAutomerge = 4;
  in_RDI->nUsermerge = 4;
  in_RDI->nCrisisMerge = 0x10;
  in_RDI->nHashSize = 0x100000;
  in_RDI->nDeleteMerge = 10;
  zSql_00 = sqlite3Fts5Mprintf((int *)&stack0xffffffffffffffec,"SELECT k, v FROM %Q.\'%q_config\'",
                               in_RDI->zDb,in_RDI->zName);
  if (zSql_00 != (char *)0x0) {
    iVar1 = sqlite3_prepare_v2((sqlite3 *)db,zSql_00,nBytes,
                               (sqlite3_stmt **)in_stack_ffffffffffffffb8,
                               (char **)in_stack_ffffffffffffffb0);
    sqlite3_free((void *)0x266d38);
  }
  if (iVar1 == 0) {
    uVar2 = 0;
    while (iVar1 = sqlite3_step((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8)),
          iVar1 == 100) {
      in_stack_ffffffffffffffb8 =
           (sqlite3_stmt *)
           sqlite3_column_text((sqlite3_stmt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffb0 =
           sqlite3_column_value((sqlite3_stmt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
      ;
      iVar1 = sqlite3_stricmp((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (char *)0x266d90);
      if (iVar1 == 0) {
        nBytes = sqlite3_value_int((sqlite3_value *)0x266da2);
      }
      else {
        sqlite3Fts5ConfigSetValue
                  (pConfig_00,zKey,(sqlite3_value *)((ulong)uVar2 << 0x20),(int *)in_RDI);
      }
    }
    iVar1 = sqlite3_finalize(in_stack_ffffffffffffffb8);
  }
  if (((iVar1 == 0) && (nBytes != 4)) && (nBytes != 5)) {
    iVar1 = 1;
    sqlite3Fts5ConfigErrmsg
              (in_RDI,"invalid fts5 file format (found %d, expected %d or %d) - run \'rebuild\'",
               (ulong)nBytes,4,5);
  }
  else {
    in_RDI->iVersion = nBytes;
  }
  if (iVar1 == 0) {
    in_RDI->iCookie = in_ESI;
  }
  if (*(Fts5Config **)(in_FS_OFFSET + 0x28) != pConfig_00) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5ConfigLoad(Fts5Config *pConfig, int iCookie){
  const char *zSelect = "SELECT k, v FROM %Q.'%q_config'";
  char *zSql;
  sqlite3_stmt *p = 0;
  int rc = SQLITE_OK;
  int iVersion = 0;

  /* Set default values */
  pConfig->pgsz = FTS5_DEFAULT_PAGE_SIZE;
  pConfig->nAutomerge = FTS5_DEFAULT_AUTOMERGE;
  pConfig->nUsermerge = FTS5_DEFAULT_USERMERGE;
  pConfig->nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
  pConfig->nHashSize = FTS5_DEFAULT_HASHSIZE;
  pConfig->nDeleteMerge = FTS5_DEFAULT_DELETE_AUTOMERGE;

  zSql = sqlite3Fts5Mprintf(&rc, zSelect, pConfig->zDb, pConfig->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pConfig->db, zSql, -1, &p, 0);
    sqlite3_free(zSql);
  }

  assert( rc==SQLITE_OK || p==0 );
  if( rc==SQLITE_OK ){
    while( SQLITE_ROW==sqlite3_step(p) ){
      const char *zK = (const char*)sqlite3_column_text(p, 0);
      sqlite3_value *pVal = sqlite3_column_value(p, 1);
      if( 0==sqlite3_stricmp(zK, "version") ){
        iVersion = sqlite3_value_int(pVal);
      }else{
        int bDummy = 0;
        sqlite3Fts5ConfigSetValue(pConfig, zK, pVal, &bDummy);
      }
    }
    rc = sqlite3_finalize(p);
  }

  if( rc==SQLITE_OK
   && iVersion!=FTS5_CURRENT_VERSION
   && iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE
  ){
    rc = SQLITE_ERROR;
    sqlite3Fts5ConfigErrmsg(pConfig, "invalid fts5 file format "
        "(found %d, expected %d or %d) - run 'rebuild'",
        iVersion, FTS5_CURRENT_VERSION, FTS5_CURRENT_VERSION_SECUREDELETE
    );
  }else{
    pConfig->iVersion = iVersion;
  }

  if( rc==SQLITE_OK ){
    pConfig->iCookie = iCookie;
  }
  return rc;
}